

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.cc
# Opt level: O2

string_view __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeReader::Read
          (CordRepBtreeReader *this,size_t n,size_t chunk_size,CordRep **tree)

{
  CordRepBtreeNavigator *this_00;
  CordRep *pCVar1;
  size_t edge_offset;
  ulong uVar2;
  ReadResult RVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view sVar5;
  string_view local_40;
  
  this_00 = &this->navigator_;
  pCVar1 = CordRepBtreeNavigator::Current(this_00);
  if (pCVar1->length < chunk_size) {
    __assert_fail("chunk_size <= navigator_.Current()->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.cc"
                  ,0x20,
                  "absl::string_view absl::cord_internal::CordRepBtreeReader::Read(size_t, size_t, CordRep *&)"
                 );
  }
  if (chunk_size == 0) {
    pCVar1 = CordRepBtreeNavigator::Next(this_00);
    edge_offset = 0;
  }
  else {
    pCVar1 = CordRepBtreeNavigator::Current(this_00);
    edge_offset = pCVar1->length - chunk_size;
  }
  RVar3 = CordRepBtreeNavigator::Read(this_00,edge_offset,n);
  *tree = RVar3.tree;
  if (n < chunk_size) {
    local_40 = EdgeData(pCVar1);
  }
  else {
    uVar2 = n - (RVar3.n + chunk_size);
    if (this->remaining_ <= uVar2) {
      this->remaining_ = 0;
      return (string_view)ZEXT816(0);
    }
    pCVar1 = CordRepBtreeNavigator::Current(this_00);
    this->remaining_ = this->remaining_ - (uVar2 + pCVar1->length);
    local_40 = EdgeData(pCVar1);
  }
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_40,RVar3.n,0xffffffffffffffff);
  sVar5._M_len = bVar4._M_len;
  sVar5._M_str = bVar4._M_str;
  return sVar5;
}

Assistant:

absl::string_view CordRepBtreeReader::Read(size_t n, size_t chunk_size,
                                           CordRep*& tree) {
  assert(chunk_size <= navigator_.Current()->length);

  // If chunk_size is non-zero, we need to start inside last returned edge.
  // Else we start reading at the next data edge of the tree.
  CordRep* edge = chunk_size ? navigator_.Current() : navigator_.Next();
  const size_t offset = chunk_size ? edge->length - chunk_size : 0;

  // Read the sub tree and verify we got what we wanted.
  ReadResult result = navigator_.Read(offset, n);
  tree = result.tree;

  // If the data returned in `tree` was covered entirely by `chunk_size`, i.e.,
  // read from the 'previous' edge, we did not consume any additional data, and
  // can directly return the substring into the current data edge as the next
  // chunk. We can easily establish from the above code that `navigator_.Next()`
  // has not been called as that requires `chunk_size` to be zero.
  if (n < chunk_size) return EdgeData(edge).substr(result.n);

  // The amount of data taken from the last edge is `chunk_size` and `result.n`
  // contains the offset into the current edge trailing the read data (which can
  // be 0). As the call to `navigator_.Read()` could have consumed all remaining
  // data, calling `navigator_.Current()` is not safe before checking if we
  // already consumed all remaining data.
  const size_t consumed_by_read = n - chunk_size - result.n;
  if (consumed_by_read >= remaining_) {
    remaining_ = 0;
    return {};
  }

  // We did not read all data, return remaining data from current edge.
  edge = navigator_.Current();
  remaining_ -= consumed_by_read + edge->length;
  return EdgeData(edge).substr(result.n);
}